

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

int duckdb_brotli::BrotliDecoderAttachDictionary
              (BrotliDecoderStateInternal *state,BrotliSharedDictionaryType type,size_t data_size,
              uint8_t *data)

{
  int iVar1;
  uint8_t *size;
  BrotliDecoderStateInternal *in_RCX;
  size_t in_RDX;
  BrotliSharedDictionaryType in_ESI;
  int *in_RDI;
  uint64_t num_prefix_before;
  uint64_t i;
  uint8_t *data_00;
  int local_4;
  
  size = (uint8_t *)(ulong)**(uint **)(in_RDI + 200);
  if (*in_RDI == 0) {
    iVar1 = BrotliSharedDictionaryAttach
                      (*(BrotliSharedDictionaryInternal **)(in_RDI + 200),in_ESI,in_RDX,
                       (uint8_t *)in_RCX);
    data_00 = size;
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      for (; data_00 < (uint8_t *)(ulong)**(uint **)(in_RDI + 200); data_00 = data_00 + 1) {
        iVar1 = AttachCompoundDictionary(in_RCX,data_00,(size_t)size);
        if (iVar1 == 0) {
          return 0;
        }
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BROTLI_BOOL BrotliDecoderAttachDictionary(BrotliDecoderState *state, BrotliSharedDictionaryType type, size_t data_size,
                                          const uint8_t data[BROTLI_ARRAY_PARAM(data_size)]) {
	brotli_reg_t i;
	brotli_reg_t num_prefix_before = state->dictionary->num_prefix;
	if (state->state != BROTLI_STATE_UNINITED)
		return BROTLI_FALSE;
	if (!BrotliSharedDictionaryAttach(state->dictionary, type, data_size, data)) {
		return BROTLI_FALSE;
	}
	for (i = num_prefix_before; i < state->dictionary->num_prefix; i++) {
		if (!AttachCompoundDictionary(state, state->dictionary->prefix[i], state->dictionary->prefix_size[i])) {
			return BROTLI_FALSE;
		}
	}
	return BROTLI_TRUE;
}